

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webmenc.cc
# Opt level: O0

int write_webm_block(WebmOutputContext *webm_ctx,aom_codec_enc_cfg_t *cfg,aom_codec_cx_pkt_t *pkt)

{
  bool bVar1;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int64_t pts_ns;
  Segment *segment;
  bool in_stack_00000057;
  uint64_t in_stack_00000058;
  uint64_t in_stack_00000060;
  uint64_t in_stack_00000068;
  uint8_t *in_stack_00000070;
  Segment *in_stack_00000078;
  long local_30;
  int local_4;
  
  if (*(long *)(in_RDI + 0x20) == 0) {
    fprintf(_stderr,"webmenc> segment is NULL.\n");
    local_4 = -1;
  }
  else {
    local_30 = (*(long *)(in_RDX + 0x18) * 1000000000 * (long)*(int *)(in_RSI + 0x28)) /
               (long)*(int *)(in_RSI + 0x2c);
    if (local_30 <= *(long *)(in_RDI + 0x10)) {
      local_30 = *(long *)(in_RDI + 0x10) + 1000000;
    }
    *(long *)(in_RDI + 0x10) = local_30;
    bVar1 = mkvmuxer::Segment::AddFrame
                      (in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
                       in_stack_00000058,in_stack_00000057);
    if (bVar1) {
      local_4 = 0;
    }
    else {
      fprintf(_stderr,"webmenc> AddFrame failed.\n");
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int write_webm_block(struct WebmOutputContext *webm_ctx,
                     const aom_codec_enc_cfg_t *cfg,
                     const aom_codec_cx_pkt_t *pkt) {
  if (!webm_ctx->segment) {
    fprintf(stderr, "webmenc> segment is NULL.\n");
    return -1;
  }
  mkvmuxer::Segment *const segment =
      reinterpret_cast<mkvmuxer::Segment *>(webm_ctx->segment);
  int64_t pts_ns = pkt->data.frame.pts * 1000000000ll * cfg->g_timebase.num /
                   cfg->g_timebase.den;
  if (pts_ns <= webm_ctx->last_pts_ns) pts_ns = webm_ctx->last_pts_ns + 1000000;
  webm_ctx->last_pts_ns = pts_ns;

  if (!segment->AddFrame(static_cast<uint8_t *>(pkt->data.frame.buf),
                         pkt->data.frame.sz, kVideoTrackNumber, pts_ns,
                         pkt->data.frame.flags & AOM_FRAME_IS_KEY)) {
    fprintf(stderr, "webmenc> AddFrame failed.\n");
    return -1;
  }
  return 0;
}